

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface.cpp
# Opt level: O3

double __thiscall Interface::log(Interface *this,double __x)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  double dVar2;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->logout,(char *)*in_RSI,in_RSI[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  dVar2 = (double)std::ostream::flush();
  if (this->if_file != false) {
    return dVar2;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*in_RSI,in_RSI[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  dVar2 = (double)std::ostream::flush();
  return dVar2;
}

Assistant:

void Interface::log(string s) {
    logout << s << endl;
    if (!if_file)
        cout << s << endl;
}